

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void sendsuboption(connectdata *conn,int option)

{
  SessionHandle *data_00;
  HTTP *pHVar1;
  undefined1 *puVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ssize_t sVar5;
  uint *puVar6;
  TELNET *tn;
  SessionHandle *data;
  uchar *uc2;
  uchar *uc1;
  unsigned_short y;
  unsigned_short x;
  int err;
  ssize_t bytes_written;
  int option_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pHVar1 = (data_00->state).proto.http;
  if (option == 0x1f) {
    pHVar1[0x39].backup.postsize = (curl_off_t)&pHVar1[0x36].postsize;
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = 0xff;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = 0xfa;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = 0x1f;
    }
    uVar3 = htons(*(uint16_t *)&pHVar1[0x35].send_buffer);
    uVar4 = htons(*(uint16_t *)((long)&pHVar1[0x35].send_buffer + 2));
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      uc1._2_1_ = (undefined1)uVar3;
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = uc1._2_1_;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      uc1._3_1_ = (undefined1)(uVar3 >> 8);
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = uc1._3_1_;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      uc1._0_1_ = (undefined1)uVar4;
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = uc1._0_1_;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      uc1._1_1_ = (undefined1)(uVar4 >> 8);
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = uc1._1_1_;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = 0xff;
    }
    if ((undefined1 *)pHVar1[0x39].backup.postsize < &pHVar1[0x39].backup.postsize) {
      puVar2 = (undefined1 *)pHVar1[0x39].backup.postsize;
      pHVar1[0x39].backup.postsize = (curl_off_t)(puVar2 + 1);
      *puVar2 = 0xf0;
    }
    *(curl_off_t *)&pHVar1[0x39].sending = pHVar1[0x39].backup.postsize;
    pHVar1[0x39].backup.postsize = (curl_off_t)&pHVar1[0x36].postsize;
    printsub(data_00,0x3e,(uchar *)((long)&pHVar1[0x36].postsize + 2),
             (*(long *)&pHVar1[0x39].sending - pHVar1[0x39].backup.postsize) - 2);
    sVar5 = send(conn->sock[0],&pHVar1[0x36].postsize,3,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
    send_telnet_data(conn,(char *)((long)&pHVar1[0x36].postsize + 3),4);
    sVar5 = send(conn->sock[0],(void *)((long)&pHVar1[0x36].postsize + 7),2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data_00,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char*uc1, *uc2;

  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  switch (option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with litte or big endien processors */
    /* Window size must be sent according to the 'network order' */
    x=htons(tn->subopt_wsx);
    y=htons(tn->subopt_wsy);
    uc1 = (unsigned char*)&x;
    uc2 = (unsigned char*)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer+2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer+3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer+7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}